

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasum.c
# Opt level: O2

doublereal dasum_(integer *n,doublereal *dx,integer *incx)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  double dVar17;
  
  uVar7 = *n;
  dVar17 = 0.0;
  if (0 < (int)uVar7) {
    uVar8 = *incx;
    if (0 < (int)uVar8) {
      if (uVar8 == 1) {
        if (uVar7 % 6 != 0) {
          for (uVar10 = 0; (ulong)uVar7 % 6 != uVar10; uVar10 = uVar10 + 1) {
            dVar1 = dx[uVar10];
            uVar11 = -(ulong)(-dVar1 <= dVar1);
            dVar17 = dVar17 + (double)(~uVar11 & (ulong)-dVar1 | (ulong)dVar1 & uVar11);
          }
          if ((int)uVar7 < 6) {
            return dVar17;
          }
        }
        for (uVar10 = (ulong)(uVar7 % 6 + 1); (int)uVar10 <= (int)uVar7; uVar10 = uVar10 + 6) {
          dVar1 = dx[uVar10 - 1];
          dVar2 = dx[uVar10];
          uVar11 = -(ulong)(-dVar1 <= dVar1);
          uVar12 = -(ulong)(-dVar2 <= dVar2);
          dVar3 = dx[uVar10 + 1];
          uVar13 = -(ulong)(-dVar3 <= dVar3);
          dVar4 = dx[uVar10 + 2];
          uVar14 = -(ulong)(-dVar4 <= dVar4);
          dVar5 = dx[uVar10 + 3];
          uVar15 = -(ulong)(-dVar5 <= dVar5);
          dVar6 = dx[uVar10 + 4];
          uVar16 = -(ulong)(-dVar6 <= dVar6);
          dVar17 = (double)(~uVar16 & (ulong)-dVar6 | (ulong)dVar6 & uVar16) +
                   (double)(~uVar15 & (ulong)-dVar5 | (ulong)dVar5 & uVar15) +
                   (double)(~uVar14 & (ulong)-dVar4 | (ulong)dVar4 & uVar14) +
                   (double)(~uVar13 & (ulong)-dVar3 | (ulong)dVar3 & uVar13) +
                   (double)(~uVar12 & (ulong)-dVar2 | (ulong)dVar2 & uVar12) +
                   dVar17 + (double)(~uVar11 & (ulong)-dVar1 | (ulong)dVar1 & uVar11);
        }
      }
      else {
        for (iVar9 = 1; iVar9 <= (int)(uVar7 * uVar8); iVar9 = iVar9 + uVar8) {
          dVar1 = *dx;
          uVar10 = -(ulong)(-dVar1 <= dVar1);
          dVar17 = dVar17 + (double)(~uVar10 & (ulong)-dVar1 | (ulong)dVar1 & uVar10);
          dx = dx + uVar8;
        }
      }
    }
  }
  return dVar17;
}

Assistant:

doublereal dasum_(integer *n, doublereal *dx, integer *incx)
{


    /* System generated locals */
 
    doublereal ret_val, d__1, d__2, d__3, d__4, d__5, d__6;

    /* Local variables */
    integer i, m;
    doublereal dtemp;
    integer nincx, mp1;


/*     takes the sum of the absolute values.   
       jack dongarra, linpack, 3/11/78.   
       modified 3/93 to return if incx .le. 0.   
       modified 12/3/93, array(1) declarations changed to array(*)   


    
   Parameter adjustments   
       Function Body */
#define DX(I) dx[(I)-1]


    ret_val = 0.;
    dtemp = 0.;
    if (*n <= 0 || *incx <= 0) {
	return ret_val;
    }
    if (*incx == 1) {
	goto L20;
    }

/*        code for increment not equal to 1 */

    nincx = *n * *incx;
    for (i = 1; *incx < 0 ? i >= nincx : i <= nincx; i += *incx) {
	dtemp += (d__1 = DX(i), abs(d__1));
/* L10: */
    }
    ret_val = dtemp;
    return ret_val;

/*        code for increment equal to 1   


          clean-up loop */

L20:
    m = *n % 6;
    if (m == 0) {
	goto L40;
    }
    for (i = 1; i <= m; ++i) {
	dtemp += (d__1 = DX(i), abs(d__1));
/* L30: */
    }
    if (*n < 6) {
	goto L60;
    }
L40:
    mp1 = m + 1;
    for (i = mp1; i <= *n; i += 6) {
	dtemp = dtemp + (d__1 = DX(i), abs(d__1)) + (d__2 = DX(i + 1), abs(
		d__2)) + (d__3 = DX(i + 2), abs(d__3)) + (d__4 = DX(i + 3), 
		abs(d__4)) + (d__5 = DX(i + 4), abs(d__5)) + (d__6 = DX(i + 5)
		, abs(d__6));
/* L50: */
    }
L60:
    ret_val = dtemp;
    return ret_val;
}